

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat __thiscall Mat::Inverse(Mat *this)

{
  uint uVar1;
  ulong uVar2;
  double *pdVar3;
  double *__s;
  double *extraout_RDX;
  Mat *in_RSI;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  Mat MVar8;
  Mat yy;
  Mat xx;
  Mat local_b8;
  ulong local_a8;
  double *local_a0;
  Mat *local_98;
  long local_90;
  long local_88;
  Mat *local_80;
  ulong local_78;
  Mat local_70;
  Mat local_60;
  Mat local_50;
  Mat local_40;
  
  uVar1 = in_RSI->n_rows_;
  lVar7 = (long)(int)uVar1;
  uVar2 = (ulong)uVar1;
  this->n_rows_ = uVar1;
  this->n_cols_ = uVar1;
  local_98 = in_RSI;
  if (lVar7 == 0) {
    pdVar3 = (double *)0x0;
  }
  else {
    pdVar3 = (double *)operator_new__((ulong)(uVar1 * uVar1) << 3);
  }
  this->v_ = pdVar3;
  local_80 = this;
  if (0 < (int)uVar1) {
    iVar6 = 0;
    uVar4 = 0;
    uVar5 = uVar2;
    do {
      memset(pdVar3 + uVar4,0,uVar2 * 8);
      pdVar3[iVar6] = 1.0;
      uVar4 = (ulong)((int)uVar4 + uVar1);
      iVar6 = iVar6 + uVar1 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  local_a8 = (ulong)(uint)local_98->n_cols_;
  local_70.n_cols_ = 1;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)uVar1) {
    uVar5 = lVar7 << 3;
  }
  local_70.n_rows_ = uVar1;
  __s = (double *)operator_new__(uVar5);
  local_70.v_ = __s;
  if (0 < (int)uVar1) {
    memset(__s,0,uVar2 * 8);
  }
  local_b8.n_cols_ = 1;
  local_b8.n_rows_ = uVar1;
  local_b8.v_ = (double *)operator_new__(uVar5);
  if (0 < (int)uVar1) {
    memset(local_b8.v_,0,uVar2 * 8);
  }
  if (0 < (int)local_a8) {
    local_90 = uVar2 * 8;
    uVar5 = 0;
    local_88 = lVar7;
    do {
      local_a0 = pdVar3;
      local_78 = uVar5;
      if (0 < (int)local_88) {
        uVar5 = 0;
        do {
          __s[uVar5] = *pdVar3;
          Mat(&local_60,&local_70);
          GaussLin(&local_50,local_98,(int)&local_60);
          operator=(&local_40,&local_b8);
          if (local_40.v_ != (double *)0x0) {
            operator_delete__(local_40.v_);
          }
          if (local_50.v_ != (double *)0x0) {
            operator_delete__(local_50.v_);
          }
          if (local_60.v_ != (double *)0x0) {
            operator_delete__(local_60.v_);
          }
          uVar5 = uVar5 + 1;
          pdVar3 = (double *)((long)pdVar3 + local_90);
        } while (uVar2 != uVar5);
      }
      if (0 < (int)local_88) {
        uVar5 = 0;
        pdVar3 = local_a0;
        do {
          *pdVar3 = local_b8.v_[uVar5];
          uVar5 = uVar5 + 1;
          pdVar3 = (double *)((long)pdVar3 + local_90);
        } while (uVar2 != uVar5);
      }
      uVar5 = local_78 + 1;
      pdVar3 = local_a0 + 1;
    } while (uVar5 != local_a8);
  }
  if (local_b8.v_ != (double *)0x0) {
    operator_delete__(local_b8.v_);
  }
  operator_delete__(__s);
  MVar8.v_ = extraout_RDX;
  MVar8._0_8_ = local_80;
  return MVar8;
}

Assistant:

Mat Mat::Inverse() const
{
	int i,j;
	int n = n_rows_;
	Mat ainv(n,n);
	for (i=0; i<n; i++) {
		for (j=0; j<n; j++) ainv(i,j) = 0.;
		ainv(i,i) = 1.;
	}
	int m = n_cols_;	
	Mat xx(n), yy(n);
	for (j = 0; j < m; j++) {
		for (i=0; i<n; i++) {
			xx(i) = ainv(i,j);
			yy = GaussLin(xx,n);
		}
		for (i=0; i<n; i++)
			ainv(i,j) = yy(i);
	}
	return ainv;
}